

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation_algorithm.cpp
# Opt level: O2

ElnDist * __thiscall
indigox::algorithm::ElectronOptimisationAlgorithm::CalculateUpperLimit
          (ElnDist *__return_storage_ptr__,ElectronOptimisationAlgorithm *this)

{
  ulong *puVar1;
  ulong uVar2;
  ElectronOptimisationAlgorithm *this_00;
  Score SVar3;
  const_iterator __pos;
  size_type sVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  iterator __begin2;
  size_t mPos;
  Score local_ac;
  ElectronOptimisationAlgorithm *local_a8;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> all_pos;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,&this->previousDist_);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (__return_storage_ptr__);
  __pos._M_node = &all_pos._M_t._M_impl.super__Rb_tree_header._M_header;
  all_pos._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  all_pos._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  all_pos._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  all_pos._M_t._M_impl.super__Rb_tree_header._M_header._M_left = __pos._M_node;
  all_pos._M_t._M_impl.super__Rb_tree_header._M_header._M_right = __pos._M_node;
  for (mPos = 0; mPos < __return_storage_ptr__->m_num_bits; mPos = mPos + 1) {
    __pos._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
         ::_M_insert_unique_<unsigned_long_const&>
                   ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                     *)&all_pos,__pos,&mPos);
  }
  local_a8 = this;
  while( true ) {
    this_00 = local_a8;
    sVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                      (__return_storage_ptr__);
    if (this_00->parent_->electronsToAdd_ <= sVar4) break;
    local_ac = Options::AssignElectrons::INF;
    mPos = *(size_t *)(all_pos._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    for (p_Var5 = all_pos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &all_pos._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      uVar2 = *(ulong *)(p_Var5 + 1);
      uVar6 = 1L << ((byte)uVar2 & 0x3f);
      puVar1 = (__return_storage_ptr__->m_bits).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar2 >> 6);
      *puVar1 = *puVar1 | uVar6;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_50,__return_storage_ptr__);
      SVar3 = CalculateDistributionEnergy(local_a8,&local_50);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50);
      if (SVar3 < local_ac) {
        mPos = uVar2;
        local_ac = SVar3;
      }
      puVar1 = (__return_storage_ptr__->m_bits).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar2 >> 6);
      *puVar1 = *puVar1 & ~uVar6;
    }
    puVar1 = (__return_storage_ptr__->m_bits).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + (mPos >> 6);
    *puVar1 = *puVar1 | 1L << ((byte)mPos & 0x3f);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::erase(&all_pos._M_t,&mPos);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_70,__return_storage_ptr__);
  SVar3 = CalculateDistributionEnergy(this_00,&local_70);
  this_00->upperLimit_ = SVar3;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70);
  if (this_00->upperLimit_ < Options::AssignElectrons::INF) {
    this_00->upperLimit_ = this_00->upperLimit_ + 1;
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&all_pos._M_t);
  return __return_storage_ptr__;
}

Assistant:

ElnDist ElectronOptimisationAlgorithm::CalculateUpperLimit() {
//  bool tmp_allow_charged_carbon = opt_::ALLOW_CHARGED_CARBON;
//  opt_::ALLOW_CHARGED_CARBON = true;
//  uint32_t tmp_high_charge = opt_::HIGHEST_MAGNITUDE_CHARGE;
//  opt_::HIGHEST_MAGNITUDE_CHARGE = 0;
  
  ElnDist initDist = ElnDist(previousDist_);
  initDist.reset();
  std::set<size_t> all_pos;
  std::set<size_t>::const_iterator it = all_pos.begin();
  for (size_t i = 0; i < initDist.size(); ++i) it = all_pos.insert(it, i);
  
  while (initDist.count() < parent_->electronsToAdd_) {
    Score cMin = opt_::INF;
    size_t mPos = *(all_pos.begin());
    for (size_t i : all_pos) {
      initDist.set(i);
      Score tmp = CalculateDistributionEnergy(initDist);
      if (tmp < cMin) {
        cMin = tmp;
        mPos = i;
      }
      initDist.reset(i);
    }
    initDist.set(mPos);
    all_pos.erase(mPos);
  }
  upperLimit_ = CalculateDistributionEnergy(initDist);
  
//  opt_::ALLOW_CHARGED_CARBON = tmp_allow_charged_carbon;
//  opt_::HIGHEST_MAGNITUDE_CHARGE = tmp_high_charge;
  
  if (upperLimit_ < opt_::INF) ++upperLimit_;
  return initDist;
}